

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O0

void __thiscall QListModel::move(QListModel *this,int srcRow,int dstRow)

{
  byte bVar1;
  long from;
  qsizetype qVar2;
  long to;
  uint in_EDX;
  uint in_ESI;
  QList<QListWidgetItem_*> *in_RDI;
  long in_FS_OFFSET;
  undefined1 local_38 [24];
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_ESI != in_EDX) && (-1 < (int)in_ESI)) {
    from = (long)(int)in_ESI;
    qVar2 = QList<QListWidgetItem_*>::size((QList<QListWidgetItem_*> *)&(in_RDI->d).size);
    if ((from < qVar2) && (-1 < (int)in_EDX)) {
      to = (long)(int)in_EDX;
      qVar2 = QList<QListWidgetItem_*>::size((QList<QListWidgetItem_*> *)&(in_RDI->d).size);
      if (to <= qVar2) {
        QModelIndex::QModelIndex((QModelIndex *)0x89a11e);
        QModelIndex::QModelIndex((QModelIndex *)0x89a137);
        bVar1 = QAbstractItemModel::beginMoveRows
                          ((QModelIndex *)in_RDI,(int)local_20,in_ESI,(QModelIndex *)(ulong)in_ESI,
                           (int)local_38);
        if (((bVar1 ^ 0xff) & 1) == 0) {
          QList<QListWidgetItem_*>::move(in_RDI,from,to);
          QAbstractItemModel::endMoveRows();
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QListModel::move(int srcRow, int dstRow)
{
    if (srcRow == dstRow
        || srcRow < 0 || srcRow >= items.size()
        || dstRow < 0 || dstRow > items.size())
        return;

    if (!beginMoveRows(QModelIndex(), srcRow, srcRow, QModelIndex(), dstRow))
        return;
    if (srcRow < dstRow)
        --dstRow;
    items.move(srcRow, dstRow);
    endMoveRows();
}